

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_file_writer.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  Writer *__p;
  istream *piVar3;
  element_type *peVar4;
  char *pcVar5;
  size_t size;
  vector<char,_std::allocator<char>_> local_2a0;
  string local_288 [8];
  string current_line;
  shared_ptr<diffusion::Writer> file_writer;
  allocator<char> local_241;
  undefined1 local_240 [8];
  string dfsn_file;
  ifstream input_text_file;
  char **argv_local;
  int argc_local;
  
  if (argc < 3) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," diffusion_file input_text_file");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::ifstream::ifstream((undefined1 *)((long)&dfsn_file.field_2 + 8),argv[2],8);
    pcVar5 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_240,pcVar5,&local_241);
    std::allocator<char>::~allocator(&local_241);
    __p = diffusion::create_file_writer((string *)local_240);
    std::shared_ptr<diffusion::Writer>::shared_ptr<diffusion::Writer,void>
              ((shared_ptr<diffusion::Writer> *)((long)&current_line.field_2 + 8),__p);
    std::__cxx11::string::string(local_288);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(dfsn_file.field_2._M_local_buf + 8),local_288);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      peVar4 = std::__shared_ptr_access<diffusion::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<diffusion::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(current_line.field_2._M_local_buf + 8));
      pcVar5 = (char *)std::__cxx11::string::c_str();
      size = std::__cxx11::string::length();
      diffusion::to_vector_char(&local_2a0,pcVar5,size);
      (**peVar4->_vptr_Writer)(peVar4,&local_2a0);
      std::vector<char,_std::allocator<char>_>::~vector(&local_2a0);
    }
    std::__cxx11::string::~string(local_288);
    std::shared_ptr<diffusion::Writer>::~shared_ptr
              ((shared_ptr<diffusion::Writer> *)((long)&current_line.field_2 + 8));
    std::__cxx11::string::~string((string *)local_240);
    std::ifstream::~ifstream((void *)((long)&dfsn_file.field_2 + 8));
  }
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
    if (argc < 3) {
        std::cerr << "Usage: " << argv[0] << " diffusion_file input_text_file" << std::endl;
        return 0;
    }
    std::ifstream input_text_file(argv[2]);
    std::string dfsn_file = argv[1];
    auto file_writer = std::shared_ptr<diffusion::Writer>(diffusion::create_file_writer(dfsn_file));
    std::string current_line;
    while (std::getline(input_text_file, current_line)) {
        file_writer->write(diffusion::to_vector_char(current_line.c_str(), current_line.length()));
    }
    return 0;
}